

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim_sse2.c
# Opt level: O3

double SSIMGet_SSE2(uint8_t *src1,int stride1,uint8_t *src2,int stride2)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [14];
  undefined1 auVar36 [14];
  undefined1 auVar37 [14];
  undefined1 auVar38 [14];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [14];
  undefined1 auVar68 [14];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  unkuint9 Var112;
  undefined1 auVar113 [11];
  undefined1 auVar114 [15];
  unkuint9 Var115;
  undefined1 auVar116 [11];
  undefined1 auVar117 [15];
  undefined1 auVar118 [11];
  undefined1 auVar119 [15];
  undefined1 auVar120 [11];
  undefined1 auVar121 [15];
  undefined1 auVar122 [11];
  undefined1 auVar123 [15];
  undefined1 auVar124 [11];
  undefined1 auVar125 [15];
  undefined1 auVar126 [11];
  undefined1 auVar127 [15];
  undefined1 auVar128 [11];
  undefined1 auVar129 [15];
  undefined1 auVar130 [11];
  undefined1 auVar131 [15];
  undefined1 auVar132 [11];
  undefined1 auVar133 [15];
  undefined1 auVar134 [11];
  undefined1 auVar135 [15];
  undefined1 auVar136 [11];
  undefined1 auVar137 [15];
  undefined1 auVar138 [11];
  undefined1 auVar139 [15];
  undefined1 auVar140 [11];
  undefined4 uVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [14];
  undefined1 auVar144 [14];
  undefined1 auVar145 [16];
  undefined1 auVar146 [12];
  undefined1 auVar147 [14];
  undefined1 auVar148 [14];
  undefined1 auVar149 [15];
  undefined1 auVar150 [15];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  undefined1 auVar153 [15];
  undefined1 auVar154 [15];
  undefined1 auVar155 [15];
  undefined1 auVar156 [15];
  undefined1 auVar157 [15];
  undefined1 auVar158 [15];
  undefined1 auVar159 [15];
  undefined1 auVar160 [15];
  undefined1 auVar161 [15];
  undefined1 auVar162 [15];
  undefined1 auVar163 [15];
  undefined1 auVar164 [15];
  undefined1 auVar165 [15];
  undefined1 auVar166 [15];
  undefined1 auVar167 [15];
  undefined1 auVar168 [15];
  undefined1 auVar169 [15];
  undefined1 auVar170 [15];
  undefined1 auVar171 [15];
  undefined1 auVar172 [15];
  undefined1 auVar173 [15];
  undefined1 auVar174 [15];
  undefined1 auVar175 [15];
  undefined1 auVar176 [15];
  undefined1 auVar177 [12];
  undefined1 auVar178 [12];
  long lVar179;
  long lVar180;
  double dVar181;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar187 [12];
  undefined1 auVar188 [16];
  undefined1 auVar192 [12];
  undefined1 auVar193 [16];
  ushort uVar199;
  uint uVar200;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [12];
  uint uVar215;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  VP8DistoStats VStack_18;
  short sVar184;
  short sVar185;
  short sVar186;
  short sVar189;
  short sVar190;
  short sVar191;
  short sVar194;
  short sVar195;
  short sVar196;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  ushort uVar216;
  short sVar223;
  short sVar224;
  short sVar225;
  
  uVar1 = *(ulong *)src1;
  uVar2 = *(ulong *)src2;
  auVar3._8_6_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xe] = (char)(uVar1 >> 0x38);
  auVar21._8_4_ = 0;
  auVar21._0_8_ = uVar1;
  auVar21[0xc] = (char)(uVar1 >> 0x30);
  auVar21._13_2_ = auVar3._13_2_;
  auVar39._8_4_ = 0;
  auVar39._0_8_ = uVar1;
  auVar39._12_3_ = auVar21._12_3_;
  auVar53._8_2_ = 0;
  auVar53._0_8_ = uVar1;
  auVar53[10] = (char)(uVar1 >> 0x28);
  auVar53._11_4_ = auVar39._11_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar1;
  auVar69._10_5_ = auVar53._10_5_;
  auVar83[8] = (char)(uVar1 >> 0x20);
  auVar83._0_8_ = uVar1;
  auVar83._9_6_ = auVar69._9_6_;
  auVar111._7_8_ = 0;
  auVar111._0_7_ = auVar83._8_7_;
  Var112 = CONCAT81(SUB158(auVar111 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar149._9_6_ = 0;
  auVar149._0_9_ = Var112;
  auVar113._1_10_ = SUB1510(auVar149 << 0x30,5);
  auVar113[0] = (char)(uVar1 >> 0x10);
  auVar150._11_4_ = 0;
  auVar150._0_11_ = auVar113;
  uVar216 = (ushort)uVar1;
  auVar97[2] = (char)(uVar1 >> 8);
  auVar97._0_2_ = uVar216;
  auVar97._3_12_ = SUB1512(auVar150 << 0x20,3);
  auVar217._0_2_ = uVar216 & 0xff;
  auVar217._2_13_ = auVar97._2_13_;
  auVar217[0xf] = 0;
  auVar4._8_6_ = 0;
  auVar4._0_8_ = uVar2;
  auVar4[0xe] = (char)(uVar2 >> 0x38);
  auVar22._8_4_ = 0;
  auVar22._0_8_ = uVar2;
  auVar22[0xc] = (char)(uVar2 >> 0x30);
  auVar22._13_2_ = auVar4._13_2_;
  auVar40._8_4_ = 0;
  auVar40._0_8_ = uVar2;
  auVar40._12_3_ = auVar22._12_3_;
  auVar54._8_2_ = 0;
  auVar54._0_8_ = uVar2;
  auVar54[10] = (char)(uVar2 >> 0x28);
  auVar54._11_4_ = auVar40._11_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar2;
  auVar70._10_5_ = auVar54._10_5_;
  auVar84[8] = (char)(uVar2 >> 0x20);
  auVar84._0_8_ = uVar2;
  auVar84._9_6_ = auVar70._9_6_;
  auVar114._7_8_ = 0;
  auVar114._0_7_ = auVar84._8_7_;
  Var115 = CONCAT81(SUB158(auVar114 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar151._9_6_ = 0;
  auVar151._0_9_ = Var115;
  auVar116._1_10_ = SUB1510(auVar151 << 0x30,5);
  auVar116[0] = (char)(uVar2 >> 0x10);
  auVar152._11_4_ = 0;
  auVar152._0_11_ = auVar116;
  uVar199 = (ushort)uVar2;
  auVar98[2] = (char)(uVar2 >> 8);
  auVar98._0_2_ = uVar199;
  auVar98._3_12_ = SUB1512(auVar152 << 0x20,3);
  auVar201._0_2_ = uVar199 & 0xff;
  auVar201._2_13_ = auVar98._2_13_;
  auVar201[0xf] = 0;
  sVar194 = auVar97._2_2_ * 2;
  sVar195 = auVar113._0_2_ * 3;
  sVar196 = (short)Var112 * 4;
  auVar193._0_8_ =
       CONCAT26(sVar196,CONCAT24(sVar195,CONCAT22(sVar194,uVar216))) & 0xffffffffffff00ff;
  auVar193._8_2_ = auVar83._8_2_ * 3;
  auVar193._10_2_ = auVar53._10_2_ * 2;
  auVar193._12_2_ = auVar21._12_2_;
  auVar193._14_2_ = 0;
  sVar189 = auVar98._2_2_ * 2;
  sVar190 = auVar116._0_2_ * 3;
  sVar191 = (short)Var115 * 4;
  auVar188._0_8_ =
       CONCAT26(sVar191,CONCAT24(sVar190,CONCAT22(sVar189,uVar199))) & 0xffffffffffff00ff;
  auVar188._8_2_ = auVar84._8_2_ * 3;
  auVar188._10_2_ = auVar54._10_2_ * 2;
  auVar188._12_2_ = auVar22._12_2_;
  auVar188._14_2_ = 0;
  auVar232 = pmaddwd(auVar217,auVar193);
  auVar218 = pmaddwd(auVar217,auVar188);
  auVar202 = pmaddwd(auVar201,auVar188);
  lVar179 = (long)stride1;
  lVar180 = (long)stride2;
  uVar1 = *(ulong *)(src1 + lVar179);
  uVar2 = *(ulong *)(src2 + lVar180);
  auVar5._8_6_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[0xe] = (char)(uVar1 >> 0x38);
  auVar23._8_4_ = 0;
  auVar23._0_8_ = uVar1;
  auVar23[0xc] = (char)(uVar1 >> 0x30);
  auVar23._13_2_ = auVar5._13_2_;
  auVar41._8_4_ = 0;
  auVar41._0_8_ = uVar1;
  auVar41._12_3_ = auVar23._12_3_;
  auVar55._8_2_ = 0;
  auVar55._0_8_ = uVar1;
  auVar55[10] = (char)(uVar1 >> 0x28);
  auVar55._11_4_ = auVar41._11_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar1;
  auVar71._10_5_ = auVar55._10_5_;
  auVar85[8] = (char)(uVar1 >> 0x20);
  auVar85._0_8_ = uVar1;
  auVar85._9_6_ = auVar71._9_6_;
  auVar117._7_8_ = 0;
  auVar117._0_7_ = auVar85._8_7_;
  Var112 = CONCAT81(SUB158(auVar117 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar153._9_6_ = 0;
  auVar153._0_9_ = Var112;
  auVar118._1_10_ = SUB1510(auVar153 << 0x30,5);
  auVar118[0] = (char)(uVar1 >> 0x10);
  auVar154._11_4_ = 0;
  auVar154._0_11_ = auVar118;
  auVar99[2] = (char)(uVar1 >> 8);
  auVar99._0_2_ = (ushort)uVar1;
  auVar99._3_12_ = SUB1512(auVar154 << 0x20,3);
  auVar183._0_2_ = (ushort)uVar1 & 0xff;
  auVar183._2_13_ = auVar99._2_13_;
  auVar183[0xf] = 0;
  auVar6._8_6_ = 0;
  auVar6._0_8_ = uVar2;
  auVar6[0xe] = (char)(uVar2 >> 0x38);
  auVar24._8_4_ = 0;
  auVar24._0_8_ = uVar2;
  auVar24[0xc] = (char)(uVar2 >> 0x30);
  auVar24._13_2_ = auVar6._13_2_;
  auVar42._8_4_ = 0;
  auVar42._0_8_ = uVar2;
  auVar42._12_3_ = auVar24._12_3_;
  auVar56._8_2_ = 0;
  auVar56._0_8_ = uVar2;
  auVar56[10] = (char)(uVar2 >> 0x28);
  auVar56._11_4_ = auVar42._11_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar2;
  auVar72._10_5_ = auVar56._10_5_;
  auVar86[8] = (char)(uVar2 >> 0x20);
  auVar86._0_8_ = uVar2;
  auVar86._9_6_ = auVar72._9_6_;
  auVar119._7_8_ = 0;
  auVar119._0_7_ = auVar86._8_7_;
  Var115 = CONCAT81(SUB158(auVar119 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar155._9_6_ = 0;
  auVar155._0_9_ = Var115;
  auVar120._1_10_ = SUB1510(auVar155 << 0x30,5);
  auVar120[0] = (char)(uVar2 >> 0x10);
  auVar156._11_4_ = 0;
  auVar156._0_11_ = auVar120;
  auVar100[2] = (char)(uVar2 >> 8);
  auVar100._0_2_ = (ushort)uVar2;
  auVar100._3_12_ = SUB1512(auVar156 << 0x20,3);
  auVar209._0_2_ = (ushort)uVar2 & 0xff;
  auVar209._2_13_ = auVar100._2_13_;
  auVar209[0xf] = 0;
  auVar238._0_2_ = auVar183._0_2_ * 2;
  auVar238._2_2_ = auVar99._2_2_ * 4;
  auVar238._4_2_ = auVar118._0_2_ * 6;
  auVar238._6_2_ = (short)Var112 * 8;
  auVar238._8_2_ = auVar85._8_2_ * 6;
  auVar238._10_2_ = auVar55._10_2_ * 4;
  auVar238._12_2_ = auVar23._12_2_ * 2;
  auVar238._14_2_ = 0;
  auVar226._0_2_ = auVar209._0_2_ * 2;
  auVar226._2_2_ = auVar100._2_2_ * 4;
  auVar226._4_2_ = auVar120._0_2_ * 6;
  auVar226._6_2_ = (short)Var115 * 8;
  auVar226._8_2_ = auVar86._8_2_ * 6;
  auVar226._10_2_ = auVar56._10_2_ * 4;
  auVar226._12_2_ = auVar24._12_2_ * 2;
  auVar226._14_2_ = 0;
  auVar239 = pmaddwd(auVar238,auVar183);
  auVar208 = pmaddwd(auVar183,auVar226);
  auVar227 = pmaddwd(auVar226,auVar209);
  uVar1 = *(ulong *)(src1 + lVar179 * 2);
  uVar2 = *(ulong *)(src2 + lVar180 * 2);
  auVar7._8_6_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7[0xe] = (char)(uVar1 >> 0x38);
  auVar25._8_4_ = 0;
  auVar25._0_8_ = uVar1;
  auVar25[0xc] = (char)(uVar1 >> 0x30);
  auVar25._13_2_ = auVar7._13_2_;
  auVar43._8_4_ = 0;
  auVar43._0_8_ = uVar1;
  auVar43._12_3_ = auVar25._12_3_;
  auVar57._8_2_ = 0;
  auVar57._0_8_ = uVar1;
  auVar57[10] = (char)(uVar1 >> 0x28);
  auVar57._11_4_ = auVar43._11_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar1;
  auVar73._10_5_ = auVar57._10_5_;
  auVar87[8] = (char)(uVar1 >> 0x20);
  auVar87._0_8_ = uVar1;
  auVar87._9_6_ = auVar73._9_6_;
  auVar121._7_8_ = 0;
  auVar121._0_7_ = auVar87._8_7_;
  Var112 = CONCAT81(SUB158(auVar121 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar157._9_6_ = 0;
  auVar157._0_9_ = Var112;
  auVar122._1_10_ = SUB1510(auVar157 << 0x30,5);
  auVar122[0] = (char)(uVar1 >> 0x10);
  auVar158._11_4_ = 0;
  auVar158._0_11_ = auVar122;
  auVar101[2] = (char)(uVar1 >> 8);
  auVar101._0_2_ = (ushort)uVar1;
  auVar101._3_12_ = SUB1512(auVar158 << 0x20,3);
  auVar204._0_2_ = (ushort)uVar1 & 0xff;
  auVar204._2_13_ = auVar101._2_13_;
  auVar204[0xf] = 0;
  auVar8._8_6_ = 0;
  auVar8._0_8_ = uVar2;
  auVar8[0xe] = (char)(uVar2 >> 0x38);
  auVar26._8_4_ = 0;
  auVar26._0_8_ = uVar2;
  auVar26[0xc] = (char)(uVar2 >> 0x30);
  auVar26._13_2_ = auVar8._13_2_;
  auVar44._8_4_ = 0;
  auVar44._0_8_ = uVar2;
  auVar44._12_3_ = auVar26._12_3_;
  auVar58._8_2_ = 0;
  auVar58._0_8_ = uVar2;
  auVar58[10] = (char)(uVar2 >> 0x28);
  auVar58._11_4_ = auVar44._11_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar2;
  auVar74._10_5_ = auVar58._10_5_;
  auVar88[8] = (char)(uVar2 >> 0x20);
  auVar88._0_8_ = uVar2;
  auVar88._9_6_ = auVar74._9_6_;
  auVar123._7_8_ = 0;
  auVar123._0_7_ = auVar88._8_7_;
  Var115 = CONCAT81(SUB158(auVar123 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar159._9_6_ = 0;
  auVar159._0_9_ = Var115;
  auVar124._1_10_ = SUB1510(auVar159 << 0x30,5);
  auVar124[0] = (char)(uVar2 >> 0x10);
  auVar160._11_4_ = 0;
  auVar160._0_11_ = auVar124;
  auVar102[2] = (char)(uVar2 >> 8);
  auVar102._0_2_ = (ushort)uVar2;
  auVar102._3_12_ = SUB1512(auVar160 << 0x20,3);
  auVar220._0_2_ = (ushort)uVar2 & 0xff;
  auVar220._2_13_ = auVar102._2_13_;
  auVar220[0xf] = 0;
  auVar242._0_2_ = auVar204._0_2_ * 3;
  auVar242._2_2_ = auVar101._2_2_ * 6;
  auVar242._4_2_ = auVar122._0_2_ * 9;
  auVar242._6_2_ = (short)Var112 * 0xc;
  auVar242._8_2_ = auVar87._8_2_ * 9;
  auVar242._10_2_ = auVar57._10_2_ * 6;
  auVar242._12_2_ = auVar25._12_2_ * 3;
  auVar242._14_2_ = 0;
  auVar233._0_2_ = auVar220._0_2_ * 3;
  auVar233._2_2_ = auVar102._2_2_ * 6;
  auVar233._4_2_ = auVar124._0_2_ * 9;
  auVar233._6_2_ = (short)Var115 * 0xc;
  auVar233._8_2_ = auVar88._8_2_ * 9;
  auVar233._10_2_ = auVar58._10_2_ * 6;
  auVar233._12_2_ = auVar26._12_2_ * 3;
  auVar233._14_2_ = 0;
  auVar243 = pmaddwd(auVar242,auVar204);
  auVar219 = pmaddwd(auVar204,auVar233);
  auVar234 = pmaddwd(auVar233,auVar220);
  uVar1 = *(ulong *)(src1 + lVar179 * 3);
  uVar2 = *(ulong *)(src2 + lVar180 * 3);
  auVar9._8_6_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9[0xe] = (char)(uVar1 >> 0x38);
  auVar27._8_4_ = 0;
  auVar27._0_8_ = uVar1;
  auVar27[0xc] = (char)(uVar1 >> 0x30);
  auVar27._13_2_ = auVar9._13_2_;
  auVar45._8_4_ = 0;
  auVar45._0_8_ = uVar1;
  auVar45._12_3_ = auVar27._12_3_;
  auVar59._8_2_ = 0;
  auVar59._0_8_ = uVar1;
  auVar59[10] = (char)(uVar1 >> 0x28);
  auVar59._11_4_ = auVar45._11_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar1;
  auVar75._10_5_ = auVar59._10_5_;
  auVar89[8] = (char)(uVar1 >> 0x20);
  auVar89._0_8_ = uVar1;
  auVar89._9_6_ = auVar75._9_6_;
  auVar125._7_8_ = 0;
  auVar125._0_7_ = auVar89._8_7_;
  Var112 = CONCAT81(SUB158(auVar125 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar161._9_6_ = 0;
  auVar161._0_9_ = Var112;
  auVar126._1_10_ = SUB1510(auVar161 << 0x30,5);
  auVar126[0] = (char)(uVar1 >> 0x10);
  auVar162._11_4_ = 0;
  auVar162._0_11_ = auVar126;
  auVar103[2] = (char)(uVar1 >> 8);
  auVar103._0_2_ = (ushort)uVar1;
  auVar103._3_12_ = SUB1512(auVar162 << 0x20,3);
  auVar198._0_2_ = (ushort)uVar1 & 0xff;
  auVar198._2_13_ = auVar103._2_13_;
  auVar198[0xf] = 0;
  auVar10._8_6_ = 0;
  auVar10._0_8_ = uVar2;
  auVar10[0xe] = (char)(uVar2 >> 0x38);
  auVar28._8_4_ = 0;
  auVar28._0_8_ = uVar2;
  auVar28[0xc] = (char)(uVar2 >> 0x30);
  auVar28._13_2_ = auVar10._13_2_;
  auVar46._8_4_ = 0;
  auVar46._0_8_ = uVar2;
  auVar46._12_3_ = auVar28._12_3_;
  auVar60._8_2_ = 0;
  auVar60._0_8_ = uVar2;
  auVar60[10] = (char)(uVar2 >> 0x28);
  auVar60._11_4_ = auVar46._11_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar2;
  auVar76._10_5_ = auVar60._10_5_;
  auVar90[8] = (char)(uVar2 >> 0x20);
  auVar90._0_8_ = uVar2;
  auVar90._9_6_ = auVar76._9_6_;
  auVar127._7_8_ = 0;
  auVar127._0_7_ = auVar90._8_7_;
  Var115 = CONCAT81(SUB158(auVar127 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar163._9_6_ = 0;
  auVar163._0_9_ = Var115;
  auVar128._1_10_ = SUB1510(auVar163 << 0x30,5);
  auVar128[0] = (char)(uVar2 >> 0x10);
  auVar164._11_4_ = 0;
  auVar164._0_11_ = auVar128;
  auVar104[2] = (char)(uVar2 >> 8);
  auVar104._0_2_ = (ushort)uVar2;
  auVar104._3_12_ = SUB1512(auVar164 << 0x20,3);
  auVar229._0_2_ = (ushort)uVar2 & 0xff;
  auVar229._2_13_ = auVar104._2_13_;
  auVar229[0xf] = 0;
  auVar240._0_2_ = auVar198._0_2_ * 4;
  auVar240._2_2_ = auVar103._2_2_ * 8;
  auVar240._4_2_ = auVar126._0_2_ * 0xc;
  auVar240._6_2_ = (short)Var112 * 0x10;
  auVar240._8_2_ = auVar89._8_2_ * 0xc;
  auVar240._10_2_ = auVar59._10_2_ * 8;
  auVar240._12_2_ = auVar27._12_2_ * 4;
  auVar240._14_2_ = 0;
  auVar228._0_2_ = auVar229._0_2_ * 4;
  auVar228._2_2_ = auVar104._2_2_ * 8;
  auVar228._4_2_ = auVar128._0_2_ * 0xc;
  auVar228._6_2_ = (short)Var115 * 0x10;
  auVar228._8_2_ = auVar90._8_2_ * 0xc;
  auVar228._10_2_ = auVar60._10_2_ * 8;
  auVar228._12_2_ = auVar28._12_2_ * 4;
  auVar228._14_2_ = 0;
  auVar241 = pmaddwd(auVar240,auVar198);
  auVar209 = pmaddwd(auVar198,auVar228);
  auVar229 = pmaddwd(auVar228,auVar229);
  uVar1 = *(ulong *)(src1 + lVar179 * 4);
  uVar2 = *(ulong *)(src2 + lVar180 * 4);
  auVar11._8_6_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11[0xe] = (char)(uVar1 >> 0x38);
  auVar29._8_4_ = 0;
  auVar29._0_8_ = uVar1;
  auVar29[0xc] = (char)(uVar1 >> 0x30);
  auVar29._13_2_ = auVar11._13_2_;
  auVar47._8_4_ = 0;
  auVar47._0_8_ = uVar1;
  auVar47._12_3_ = auVar29._12_3_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar1;
  auVar61[10] = (char)(uVar1 >> 0x28);
  auVar61._11_4_ = auVar47._11_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar1;
  auVar77._10_5_ = auVar61._10_5_;
  auVar91[8] = (char)(uVar1 >> 0x20);
  auVar91._0_8_ = uVar1;
  auVar91._9_6_ = auVar77._9_6_;
  auVar129._7_8_ = 0;
  auVar129._0_7_ = auVar91._8_7_;
  Var112 = CONCAT81(SUB158(auVar129 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar165._9_6_ = 0;
  auVar165._0_9_ = Var112;
  auVar130._1_10_ = SUB1510(auVar165 << 0x30,5);
  auVar130[0] = (char)(uVar1 >> 0x10);
  auVar166._11_4_ = 0;
  auVar166._0_11_ = auVar130;
  auVar105[2] = (char)(uVar1 >> 8);
  auVar105._0_2_ = (ushort)uVar1;
  auVar105._3_12_ = SUB1512(auVar166 << 0x20,3);
  auVar210._0_2_ = (ushort)uVar1 & 0xff;
  auVar210._2_13_ = auVar105._2_13_;
  auVar210[0xf] = 0;
  auVar12._8_6_ = 0;
  auVar12._0_8_ = uVar2;
  auVar12[0xe] = (char)(uVar2 >> 0x38);
  auVar30._8_4_ = 0;
  auVar30._0_8_ = uVar2;
  auVar30[0xc] = (char)(uVar2 >> 0x30);
  auVar30._13_2_ = auVar12._13_2_;
  auVar48._8_4_ = 0;
  auVar48._0_8_ = uVar2;
  auVar48._12_3_ = auVar30._12_3_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar2;
  auVar62[10] = (char)(uVar2 >> 0x28);
  auVar62._11_4_ = auVar48._11_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar2;
  auVar78._10_5_ = auVar62._10_5_;
  auVar92[8] = (char)(uVar2 >> 0x20);
  auVar92._0_8_ = uVar2;
  auVar92._9_6_ = auVar78._9_6_;
  auVar131._7_8_ = 0;
  auVar131._0_7_ = auVar92._8_7_;
  Var115 = CONCAT81(SUB158(auVar131 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar167._9_6_ = 0;
  auVar167._0_9_ = Var115;
  auVar132._1_10_ = SUB1510(auVar167 << 0x30,5);
  auVar132[0] = (char)(uVar2 >> 0x10);
  auVar168._11_4_ = 0;
  auVar168._0_11_ = auVar132;
  auVar106[2] = (char)(uVar2 >> 8);
  auVar106._0_2_ = (ushort)uVar2;
  auVar106._3_12_ = SUB1512(auVar168 << 0x20,3);
  auVar231._0_2_ = (ushort)uVar2 & 0xff;
  auVar231._2_13_ = auVar106._2_13_;
  auVar231[0xf] = 0;
  auVar235._0_2_ = auVar210._0_2_ * 3;
  auVar235._2_2_ = auVar105._2_2_ * 6;
  auVar235._4_2_ = auVar130._0_2_ * 9;
  auVar235._6_2_ = (short)Var112 * 0xc;
  auVar235._8_2_ = auVar91._8_2_ * 9;
  auVar235._10_2_ = auVar61._10_2_ * 6;
  auVar235._12_2_ = auVar29._12_2_ * 3;
  auVar235._14_2_ = 0;
  auVar203._0_2_ = auVar231._0_2_ * 3;
  auVar203._2_2_ = auVar106._2_2_ * 6;
  auVar203._4_2_ = auVar132._0_2_ * 9;
  auVar203._6_2_ = (short)Var115 * 0xc;
  auVar203._8_2_ = auVar92._8_2_ * 9;
  auVar203._10_2_ = auVar62._10_2_ * 6;
  auVar203._12_2_ = auVar30._12_2_ * 3;
  auVar203._14_2_ = 0;
  auVar236 = pmaddwd(auVar235,auVar210);
  auVar220 = pmaddwd(auVar210,auVar203);
  auVar204 = pmaddwd(auVar203,auVar231);
  uVar1 = *(ulong *)(src1 + lVar179 * 5);
  uVar2 = *(ulong *)(src2 + lVar180 * 5);
  auVar13._8_6_ = 0;
  auVar13._0_8_ = uVar1;
  auVar13[0xe] = (char)(uVar1 >> 0x38);
  auVar31._8_4_ = 0;
  auVar31._0_8_ = uVar1;
  auVar31[0xc] = (char)(uVar1 >> 0x30);
  auVar31._13_2_ = auVar13._13_2_;
  auVar49._8_4_ = 0;
  auVar49._0_8_ = uVar1;
  auVar49._12_3_ = auVar31._12_3_;
  auVar63._8_2_ = 0;
  auVar63._0_8_ = uVar1;
  auVar63[10] = (char)(uVar1 >> 0x28);
  auVar63._11_4_ = auVar49._11_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar1;
  auVar79._10_5_ = auVar63._10_5_;
  auVar93[8] = (char)(uVar1 >> 0x20);
  auVar93._0_8_ = uVar1;
  auVar93._9_6_ = auVar79._9_6_;
  auVar133._7_8_ = 0;
  auVar133._0_7_ = auVar93._8_7_;
  Var112 = CONCAT81(SUB158(auVar133 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar169._9_6_ = 0;
  auVar169._0_9_ = Var112;
  auVar134._1_10_ = SUB1510(auVar169 << 0x30,5);
  auVar134[0] = (char)(uVar1 >> 0x10);
  auVar170._11_4_ = 0;
  auVar170._0_11_ = auVar134;
  auVar107[2] = (char)(uVar1 >> 8);
  auVar107._0_2_ = (ushort)uVar1;
  auVar107._3_12_ = SUB1512(auVar170 << 0x20,3);
  auVar206._0_2_ = (ushort)uVar1 & 0xff;
  auVar206._2_13_ = auVar107._2_13_;
  auVar206[0xf] = 0;
  auVar14._8_6_ = 0;
  auVar14._0_8_ = uVar2;
  auVar14[0xe] = (char)(uVar2 >> 0x38);
  auVar32._8_4_ = 0;
  auVar32._0_8_ = uVar2;
  auVar32[0xc] = (char)(uVar2 >> 0x30);
  auVar32._13_2_ = auVar14._13_2_;
  auVar50._8_4_ = 0;
  auVar50._0_8_ = uVar2;
  auVar50._12_3_ = auVar32._12_3_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar2;
  auVar64[10] = (char)(uVar2 >> 0x28);
  auVar64._11_4_ = auVar50._11_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar2;
  auVar80._10_5_ = auVar64._10_5_;
  auVar94[8] = (char)(uVar2 >> 0x20);
  auVar94._0_8_ = uVar2;
  auVar94._9_6_ = auVar80._9_6_;
  auVar135._7_8_ = 0;
  auVar135._0_7_ = auVar94._8_7_;
  Var115 = CONCAT81(SUB158(auVar135 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar171._9_6_ = 0;
  auVar171._0_9_ = Var115;
  auVar136._1_10_ = SUB1510(auVar171 << 0x30,5);
  auVar136[0] = (char)(uVar2 >> 0x10);
  auVar172._11_4_ = 0;
  auVar172._0_11_ = auVar136;
  auVar108[2] = (char)(uVar2 >> 8);
  auVar108._0_2_ = (ushort)uVar2;
  auVar108._3_12_ = SUB1512(auVar172 << 0x20,3);
  auVar222._0_2_ = (ushort)uVar2 & 0xff;
  auVar222._2_13_ = auVar108._2_13_;
  auVar222[0xf] = 0;
  auVar230._0_2_ = auVar206._0_2_ * 2;
  auVar230._2_2_ = auVar107._2_2_ * 4;
  auVar230._4_2_ = auVar134._0_2_ * 6;
  auVar230._6_2_ = (short)Var112 * 8;
  auVar230._8_2_ = auVar93._8_2_ * 6;
  auVar230._10_2_ = auVar63._10_2_ * 4;
  auVar230._12_2_ = auVar31._12_2_ * 2;
  auVar230._14_2_ = 0;
  auVar197._0_2_ = auVar222._0_2_ * 2;
  auVar197._2_2_ = auVar108._2_2_ * 4;
  auVar197._4_2_ = auVar136._0_2_ * 6;
  auVar197._6_2_ = (short)Var115 * 8;
  auVar197._8_2_ = auVar94._8_2_ * 6;
  auVar197._10_2_ = auVar64._10_2_ * 4;
  auVar197._12_2_ = auVar32._12_2_ * 2;
  auVar197._14_2_ = 0;
  auVar231 = pmaddwd(auVar230,auVar206);
  auVar210 = pmaddwd(auVar206,auVar197);
  auVar198 = pmaddwd(auVar197,auVar222);
  uVar1 = *(ulong *)(src1 + lVar179 * 6);
  uVar2 = *(ulong *)(src2 + lVar180 * 6);
  auVar15._8_6_ = 0;
  auVar15._0_8_ = uVar1;
  auVar15[0xe] = (char)(uVar1 >> 0x38);
  auVar33._8_4_ = 0;
  auVar33._0_8_ = uVar1;
  auVar33[0xc] = (char)(uVar1 >> 0x30);
  auVar33._13_2_ = auVar15._13_2_;
  auVar51._8_4_ = 0;
  auVar51._0_8_ = uVar1;
  auVar51._12_3_ = auVar33._12_3_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar1;
  auVar65[10] = (char)(uVar1 >> 0x28);
  auVar65._11_4_ = auVar51._11_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar1;
  auVar81._10_5_ = auVar65._10_5_;
  auVar95[8] = (char)(uVar1 >> 0x20);
  auVar95._0_8_ = uVar1;
  auVar95._9_6_ = auVar81._9_6_;
  auVar137._7_8_ = 0;
  auVar137._0_7_ = auVar95._8_7_;
  Var112 = CONCAT81(SUB158(auVar137 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar173._9_6_ = 0;
  auVar173._0_9_ = Var112;
  auVar138._1_10_ = SUB1510(auVar173 << 0x30,5);
  auVar138[0] = (char)(uVar1 >> 0x10);
  auVar174._11_4_ = 0;
  auVar174._0_11_ = auVar138;
  uVar199 = (ushort)uVar1;
  auVar109[2] = (char)(uVar1 >> 8);
  auVar109._0_2_ = uVar199;
  auVar109._3_12_ = SUB1512(auVar174 << 0x20,3);
  auVar205._0_2_ = uVar199 & 0xff;
  auVar205._2_13_ = auVar109._2_13_;
  auVar205[0xf] = 0;
  auVar16._8_6_ = 0;
  auVar16._0_8_ = uVar2;
  auVar16[0xe] = (char)(uVar2 >> 0x38);
  auVar34._8_4_ = 0;
  auVar34._0_8_ = uVar2;
  auVar34[0xc] = (char)(uVar2 >> 0x30);
  auVar34._13_2_ = auVar16._13_2_;
  auVar52._8_4_ = 0;
  auVar52._0_8_ = uVar2;
  auVar52._12_3_ = auVar34._12_3_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar2;
  auVar66[10] = (char)(uVar2 >> 0x28);
  auVar66._11_4_ = auVar52._11_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar2;
  auVar82._10_5_ = auVar66._10_5_;
  auVar96[8] = (char)(uVar2 >> 0x20);
  auVar96._0_8_ = uVar2;
  auVar96._9_6_ = auVar82._9_6_;
  auVar139._7_8_ = 0;
  auVar139._0_7_ = auVar96._8_7_;
  Var115 = CONCAT81(SUB158(auVar139 << 0x40,7),(char)(uVar2 >> 0x18));
  auVar175._9_6_ = 0;
  auVar175._0_9_ = Var115;
  auVar140._1_10_ = SUB1510(auVar175 << 0x30,5);
  auVar140[0] = (char)(uVar2 >> 0x10);
  auVar176._11_4_ = 0;
  auVar176._0_11_ = auVar140;
  uVar216 = (ushort)uVar2;
  auVar110[2] = (char)(uVar2 >> 8);
  auVar110._0_2_ = uVar216;
  auVar110._3_12_ = SUB1512(auVar176 << 0x20,3);
  auVar237._0_2_ = uVar216 & 0xff;
  auVar237._2_13_ = auVar110._2_13_;
  auVar237[0xf] = 0;
  sVar223 = auVar109._2_2_ * 2;
  sVar224 = auVar138._0_2_ * 3;
  sVar225 = (short)Var112 * 4;
  auVar221._0_8_ =
       CONCAT26(sVar225,CONCAT24(sVar224,CONCAT22(sVar223,uVar199))) & 0xffffffffffff00ff;
  auVar221._8_2_ = auVar95._8_2_ * 3;
  auVar221._10_2_ = auVar65._10_2_ * 2;
  auVar221._12_2_ = auVar33._12_2_;
  auVar221._14_2_ = 0;
  sVar184 = auVar110._2_2_ * 2;
  sVar185 = auVar140._0_2_ * 3;
  sVar186 = (short)Var115 * 4;
  auVar182._0_8_ =
       CONCAT26(sVar186,CONCAT24(sVar185,CONCAT22(sVar184,uVar216))) & 0xffffffffffff00ff;
  auVar182._8_2_ = auVar96._8_2_ * 3;
  auVar182._10_2_ = auVar66._10_2_ * 2;
  auVar182._12_2_ = auVar34._12_2_;
  auVar182._14_2_ = 0;
  sVar225 = sVar196 + auVar238._6_2_ + auVar242._6_2_ + auVar240._6_2_ + auVar235._6_2_ +
            auVar230._6_2_ + sVar225;
  sVar186 = sVar191 + auVar226._6_2_ + auVar233._6_2_ + auVar228._6_2_ + auVar203._6_2_ +
            auVar197._6_2_ + sVar186;
  auVar222 = pmaddwd(auVar221,auVar205);
  auVar206 = pmaddwd(auVar205,auVar182);
  auVar183 = pmaddwd(auVar182,auVar237);
  sVar191 = auVar193._10_2_ + auVar238._10_2_ + auVar242._10_2_ + auVar240._10_2_ + auVar235._10_2_
            + auVar230._10_2_ + auVar221._10_2_ +
            sVar194 + auVar238._2_2_ + auVar242._2_2_ + auVar240._2_2_ + auVar235._2_2_ +
            auVar230._2_2_ + sVar223;
  uVar199 = auVar193._12_2_ + auVar238._12_2_ + auVar242._12_2_ + auVar240._12_2_ + auVar235._12_2_
            + auVar230._12_2_ + auVar221._12_2_ +
            sVar195 + auVar238._4_2_ + auVar242._4_2_ + auVar240._4_2_ + auVar235._4_2_ +
            auVar230._4_2_ + sVar224;
  uVar141 = CONCAT22(sVar225,uVar199);
  sVar184 = auVar188._10_2_ + auVar226._10_2_ + auVar233._10_2_ + auVar228._10_2_ + auVar203._10_2_
            + auVar197._10_2_ + auVar182._10_2_ +
            sVar189 + auVar226._2_2_ + auVar233._2_2_ + auVar228._2_2_ + auVar203._2_2_ +
            auVar197._2_2_ + sVar184;
  sVar185 = auVar188._12_2_ + auVar226._12_2_ + auVar233._12_2_ + auVar228._12_2_ + auVar203._12_2_
            + auVar197._12_2_ + auVar34._12_2_ +
            sVar190 + auVar226._4_2_ + auVar233._4_2_ + auVar228._4_2_ + auVar203._4_2_ +
            auVar197._4_2_ + sVar185;
  auVar207._0_8_ = CONCAT44(uVar141,uVar141);
  auVar207._8_4_ = uVar141;
  auVar214._12_2_ = sVar225;
  auVar214._0_12_ = auVar207;
  auVar214._14_2_ = sVar186;
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._0_10_ = auVar207._0_10_;
  auVar213._10_2_ = sVar185;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar199;
  auVar212._0_8_ = auVar207._0_8_;
  auVar211._8_8_ = auVar212._8_8_;
  auVar211._6_2_ = sVar186;
  auVar211._4_2_ = sVar225;
  auVar211._0_4_ = uVar141;
  auVar142._12_4_ = 0;
  auVar142._0_12_ = auVar211._4_12_;
  uVar215 = auVar211._4_4_;
  auVar187._0_8_ = CONCAT44(uVar215,uVar215);
  auVar187._8_4_ = uVar215;
  auVar17._10_2_ = 0;
  auVar17._0_10_ = auVar187._0_10_;
  auVar17._12_2_ = sVar186;
  auVar35._8_2_ = sVar225;
  auVar35._0_8_ = auVar187._0_8_;
  auVar35._10_4_ = auVar17._10_4_;
  auVar143._6_8_ = 0;
  auVar143._0_6_ = auVar35._8_6_;
  auVar67._4_2_ = sVar186;
  auVar67._0_4_ = uVar215;
  auVar67._6_8_ = SUB148(auVar143 << 0x40,6);
  auVar18._10_2_ = 0;
  auVar18._0_10_ = SUB1610(auVar142 << 0x20,0);
  auVar18._12_2_ = sVar186;
  auVar36._8_2_ = sVar225;
  auVar36._0_8_ = SUB168(auVar142 << 0x20,0);
  auVar36._10_4_ = auVar18._10_4_;
  auVar144._6_8_ = 0;
  auVar144._0_6_ = auVar36._8_6_;
  auVar178._10_2_ = sVar186;
  auVar178._8_2_ = sVar225;
  auVar178._6_2_ = sVar185;
  auVar178._4_2_ = uVar199;
  auVar178._0_4_ = uVar141;
  auVar177._2_2_ = sVar184;
  auVar177._0_2_ = uVar199;
  auVar177._4_8_ = auVar178._4_8_;
  auVar146._2_10_ = auVar177._2_10_;
  auVar146._0_2_ = sVar191;
  auVar145._12_4_ = 0;
  auVar145._0_12_ = auVar146;
  uVar200 = auVar146._0_4_;
  auVar192._0_8_ = CONCAT44(uVar200,uVar200);
  auVar192._8_4_ = uVar200;
  auVar19._10_2_ = 0;
  auVar19._0_10_ = auVar192._0_10_;
  auVar19._12_2_ = sVar184;
  auVar37._8_2_ = sVar191;
  auVar37._0_8_ = auVar192._0_8_;
  auVar37._10_4_ = auVar19._10_4_;
  auVar147._6_8_ = 0;
  auVar147._0_6_ = auVar37._8_6_;
  auVar68._4_2_ = sVar184;
  auVar68._0_4_ = uVar200;
  auVar68._6_8_ = SUB148(auVar147 << 0x40,6);
  auVar20._10_2_ = 0;
  auVar20._0_10_ = SUB1610(auVar145 << 0x20,0);
  auVar20._12_2_ = sVar184;
  auVar38._8_2_ = sVar191;
  auVar38._0_8_ = SUB168(auVar145 << 0x20,0);
  auVar38._10_4_ = auVar20._10_4_;
  auVar148._6_8_ = 0;
  auVar148._0_6_ = auVar38._8_6_;
  VStack_18.xm = (uint)(ushort)(auVar193._8_2_ + auVar238._8_2_ + auVar242._8_2_ + auVar240._8_2_ +
                                auVar235._8_2_ + auVar230._8_2_ + auVar221._8_2_ +
                               auVar217._0_2_ + auVar238._0_2_ + auVar242._0_2_ + auVar240._0_2_ +
                               auVar235._0_2_ + auVar230._0_2_ + auVar205._0_2_) +
                 (uVar200 & 0xffff) + (uint)uVar199 + (uVar215 & 0xffff);
  VStack_18.ym = (int)CONCAT82(SUB148(auVar148 << 0x40,6),
                               auVar188._8_2_ + auVar226._8_2_ + auVar233._8_2_ + auVar228._8_2_ +
                               auVar203._8_2_ + auVar197._8_2_ + auVar182._8_2_ +
                               auVar201._0_2_ + auVar226._0_2_ + auVar233._0_2_ + auVar228._0_2_ +
                               auVar203._0_2_ + auVar197._0_2_ + auVar237._0_2_) +
                 auVar68._4_4_ + (int)CONCAT82(SUB148(auVar144 << 0x40,6),sVar185) + auVar67._4_4_;
  VStack_18.xxm =
       auVar222._12_4_ +
       auVar231._12_4_ +
       auVar236._12_4_ + auVar241._12_4_ + auVar243._12_4_ + auVar239._12_4_ + auVar232._12_4_ +
       auVar222._4_4_ +
       auVar231._4_4_ +
       auVar236._4_4_ + auVar241._4_4_ + auVar243._4_4_ + auVar239._4_4_ + auVar232._4_4_ +
       auVar222._8_4_ +
       auVar231._8_4_ +
       auVar236._8_4_ + auVar241._8_4_ + auVar243._8_4_ + auVar239._8_4_ + auVar232._8_4_ +
       auVar222._0_4_ +
       auVar231._0_4_ +
       auVar236._0_4_ + auVar241._0_4_ + auVar243._0_4_ + auVar239._0_4_ + auVar232._0_4_;
  VStack_18.xym =
       auVar206._12_4_ +
       auVar210._12_4_ +
       auVar220._12_4_ + auVar209._12_4_ + auVar219._12_4_ + auVar208._12_4_ + auVar218._12_4_ +
       auVar206._4_4_ +
       auVar210._4_4_ +
       auVar220._4_4_ + auVar209._4_4_ + auVar219._4_4_ + auVar208._4_4_ + auVar218._4_4_ +
       auVar206._8_4_ +
       auVar210._8_4_ +
       auVar220._8_4_ + auVar209._8_4_ + auVar219._8_4_ + auVar208._8_4_ + auVar218._8_4_ +
       auVar206._0_4_ +
       auVar210._0_4_ +
       auVar220._0_4_ + auVar209._0_4_ + auVar219._0_4_ + auVar208._0_4_ + auVar218._0_4_;
  VStack_18.yym =
       auVar183._12_4_ +
       auVar198._12_4_ +
       auVar204._12_4_ + auVar229._12_4_ + auVar234._12_4_ + auVar227._12_4_ + auVar202._12_4_ +
       auVar183._4_4_ +
       auVar198._4_4_ +
       auVar204._4_4_ + auVar229._4_4_ + auVar234._4_4_ + auVar227._4_4_ + auVar202._4_4_ +
       auVar183._8_4_ +
       auVar198._8_4_ +
       auVar204._8_4_ + auVar229._8_4_ + auVar234._8_4_ + auVar227._8_4_ + auVar202._8_4_ +
       auVar183._0_4_ +
       auVar198._0_4_ +
       auVar204._0_4_ + auVar229._0_4_ + auVar234._0_4_ + auVar227._0_4_ + auVar202._0_4_;
  dVar181 = VP8SSIMFromStats(&VStack_18);
  return dVar181;
}

Assistant:

double SSIMGet_SSE2(const uint8_t* src1, int stride1,
                           const uint8_t* src2, int stride2) {
  VP8DistoStats stats;
  const __m128i zero = _mm_setzero_si128();
  __m128i xm = zero, ym = zero;                // 16b accums
  __m128i xxm = zero, yym = zero, xym = zero;  // 32b accum
  const __m128i Wx = _mm_loadu_si128((const __m128i*)kWeight);
  assert(2 * VP8_SSIM_KERNEL + 1 == 7);
  ACCUMULATE_ROW(1);
  ACCUMULATE_ROW(2);
  ACCUMULATE_ROW(3);
  ACCUMULATE_ROW(4);
  ACCUMULATE_ROW(3);
  ACCUMULATE_ROW(2);
  ACCUMULATE_ROW(1);
  stats.xm  = HorizontalAdd16b_SSE2(&xm);
  stats.ym  = HorizontalAdd16b_SSE2(&ym);
  stats.xxm = HorizontalAdd32b_SSE2(&xxm);
  stats.xym = HorizontalAdd32b_SSE2(&xym);
  stats.yym = HorizontalAdd32b_SSE2(&yym);
  return VP8SSIMFromStats(&stats);
}